

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  char cVar1;
  int iVar2;
  long *plVar3;
  long lVar4;
  long *extraout_RDX;
  long extraout_RDX_00;
  uint uVar5;
  error_code ec;
  undefined4 local_58 [2];
  long *local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  long *local_40;
  long local_38 [2];
  
  local_50 = (long *)ntkernel_error_category::ntkernel_category();
  local_58[0] = 0xc000003a;
  (**(code **)(*local_50 + 0x20))(&local_48,local_50,0xc000003a);
  plVar3 = (long *)CONCAT44(uStack_44,local_48);
  iVar2 = strcmp((char *)plVar3,"{Path Not Found}\nThe path %hs does not exist.");
  if (plVar3 != local_38) {
    operator_delete(plVar3,local_38[0] + 1);
  }
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "!strcmp(ec.message().c_str(), \"{Path Not Found}\\nThe path %hs does not exist.\") failed at line "
               ,0x5f);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x2f);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
  }
  uVar5 = (uint)(iVar2 != 0);
  std::error_code::default_error_condition();
  local_40 = (long *)std::_V2::generic_category();
  if (extraout_RDX != local_40) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "ec.default_error_condition().category() == std::generic_category() failed at line ",
               0x52);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x31);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    uVar5 = 1;
  }
  local_48 = 2;
  cVar1 = (**(code **)(*local_50 + 0x30))(local_50,local_58[0]);
  if ((cVar1 == '\0') &&
     (cVar1 = (**(code **)(*local_40 + 0x38))(local_40,local_58,local_48), cVar1 == '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ec == std::errc::no_such_file_or_directory failed at line ",
               0x3a);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x32);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    uVar5 = 1;
  }
  local_50 = (long *)ntkernel_error_category::ntkernel_category();
  local_58[0] = 0xc000003b;
  (**(code **)(*local_50 + 0x20))(&local_48,local_50,0xc000003b);
  plVar3 = (long *)CONCAT44(uStack_44,local_48);
  iVar2 = strcmp((char *)plVar3,"Object Path Component was not a directory object.");
  if (plVar3 != local_38) {
    operator_delete(plVar3,local_38[0] + 1);
  }
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "!strcmp(ec.message().c_str(), \"Object Path Component was not a directory object.\") failed at line "
               ,0x62);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x3e);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    uVar5 = 1;
  }
  std::error_code::default_error_condition();
  lVar4 = ntkernel_error_category::ntkernel_category();
  if (extraout_RDX_00 != lVar4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "ec.default_error_condition().category() == ntkernel_category() failed at line ",0x4e
              );
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x40);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    uVar5 = 1;
  }
  return uVar5;
}

Assistant:

int main()
{
  using namespace ntkernel_error_category;
  int retcode = 0;
  {
    std::error_code ec(static_cast<int>(0xc000003a), ntkernel_category());  // STATUS_OBJECT_PATH_NOT_FOUND
    CHECK(!strcmp(ec.message().c_str(), "{Path Not Found}\nThe path %hs does not exist."));
    // This is mapped to generic_category
    CHECK(ec.default_error_condition().category() == std::generic_category());
    CHECK(ec == std::errc::no_such_file_or_directory);
#ifdef _WIN32
    // Check we can compare to win32 error codes
    std::error_code winec(ERROR_PATH_NOT_FOUND, std::system_category());
    // Compare via mapping winec to generic_category and comparing generic_categories
    CHECK(ec == winec.default_error_condition());
    // Compare via mapping ec to generic_category and comparing generic_categories
    CHECK(ec.default_error_condition() == winec);
#endif
  }
  {
    std::error_code ec(static_cast<int>(0xc000003b), ntkernel_category());  // STATUS_OBJECT_PATH_SYNTAX_BAD
    CHECK(!strcmp(ec.message().c_str(), "Object Path Component was not a directory object."));
    // This has no mapping to generic_category
    CHECK(ec.default_error_condition().category() == ntkernel_category());
#ifdef _WIN32
    // Check we can compare to win32 error codes
    std::error_code winec(ERROR_BAD_PATHNAME, std::system_category());
    // Compare via ntkernel_category's special support for system_category
    CHECK(ec == winec.default_error_condition());
    // Compare via ntkernel_category's special support for system_category
    CHECK(ec.default_error_condition() == winec);
#endif
  }
  return retcode;
}